

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O2

void ncnn::copy_make_border_image<float>(Mat *src,Mat *dst,int top,int left,int type,float v)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int x_1;
  long lVar4;
  ulong uVar5;
  long lVar6;
  undefined4 *puVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  undefined4 *puVar11;
  long lVar12;
  int iVar13;
  undefined4 *puVar14;
  int iVar15;
  int iVar16;
  void *pvVar17;
  ulong uVar18;
  undefined4 *puVar19;
  
  uVar2 = dst->w;
  lVar12 = (long)(int)uVar2;
  iVar3 = dst->h;
  puVar19 = (undefined4 *)src->data;
  pvVar17 = dst->data;
  lVar4 = (long)left;
  if (type == 0) {
    iVar16 = 0;
    uVar18 = 0;
    if (0 < (int)uVar2) {
      uVar18 = (ulong)uVar2;
    }
    iVar13 = 0;
    if (0 < top) {
      iVar13 = top;
    }
    lVar1 = lVar12 * 4;
    for (; iVar16 != iVar13; iVar16 = iVar16 + 1) {
      for (uVar5 = 0; uVar18 != uVar5; uVar5 = uVar5 + 1) {
        *(float *)((long)pvVar17 + uVar5 * 4) = v;
      }
      pvVar17 = (void *)((long)pvVar17 + lVar1);
    }
    uVar5 = 0;
    if (0 < left) {
      uVar5 = (ulong)(uint)left;
    }
    for (; iVar13 < src->h + top; iVar13 = iVar13 + 1) {
      for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
        *(float *)((long)pvVar17 + uVar8 * 4) = v;
      }
      iVar16 = src->w;
      if ((long)iVar16 < 0xc) {
        for (uVar8 = uVar5; (long)uVar8 < (long)(left + iVar16); uVar8 = uVar8 + 1) {
          *(undefined4 *)((long)pvVar17 + uVar8 * 4) = puVar19[uVar8 - lVar4];
        }
      }
      else {
        memcpy((void *)(lVar4 * 4 + (long)pvVar17),puVar19,(long)iVar16 << 2);
        iVar16 = src->w;
        uVar8 = (ulong)(uint)(iVar16 + (int)uVar5);
      }
      for (lVar6 = (long)(int)uVar8; lVar6 < lVar12; lVar6 = lVar6 + 1) {
        *(float *)((long)pvVar17 + lVar6 * 4) = v;
      }
      puVar19 = puVar19 + iVar16;
      pvVar17 = (void *)((long)pvVar17 + lVar1);
    }
    for (; iVar13 < iVar3; iVar13 = iVar13 + 1) {
      for (uVar5 = 0; uVar18 != uVar5; uVar5 = uVar5 + 1) {
        *(float *)((long)pvVar17 + uVar5 * 4) = v;
      }
      pvVar17 = (void *)((long)pvVar17 + lVar1);
    }
  }
  else if (type == 2) {
    uVar2 = src->w;
    puVar19 = puVar19 + (int)(uVar2 * top);
    iVar16 = 0;
    uVar18 = 0;
    if (0 < left) {
      uVar18 = (ulong)(uint)left;
    }
    iVar13 = 0;
    if (0 < top) {
      iVar13 = top;
    }
    lVar1 = lVar12 * 4;
    puVar14 = (undefined4 *)(uVar18 * 4 + (long)pvVar17);
    iVar15 = left + -2;
    while( true ) {
      uVar5 = (ulong)uVar2;
      iVar10 = (int)uVar18;
      if (iVar16 == iVar13) break;
      puVar7 = puVar19 + lVar4;
      for (uVar8 = 0; uVar18 != uVar8; uVar8 = uVar8 + 1) {
        *(undefined4 *)((long)pvVar17 + uVar8 * 4) = *puVar7;
        puVar7 = puVar7 + -1;
      }
      if ((int)uVar2 < 0xc) {
        for (uVar5 = uVar18; (long)uVar5 < (long)(int)(uVar2 + left); uVar5 = uVar5 + 1) {
          *(undefined4 *)((long)pvVar17 + uVar5 * 4) = puVar19[uVar5 - lVar4];
        }
        uVar2 = src->w;
      }
      else {
        memcpy((void *)(lVar4 * 4 + (long)pvVar17),puVar19,uVar5 << 2);
        uVar2 = src->w;
        uVar5 = (ulong)(uVar2 + iVar10);
      }
      iVar10 = (iVar15 + uVar2 * 2) - (int)uVar5;
      for (lVar6 = (long)(int)uVar5; lVar6 < lVar12; lVar6 = lVar6 + 1) {
        *(undefined4 *)((long)pvVar17 + lVar6 * 4) = puVar19[iVar10];
        iVar10 = iVar10 + -1;
      }
      pvVar17 = (void *)((long)pvVar17 + lVar1);
      puVar19 = puVar19 + -(long)(int)uVar2;
      iVar16 = iVar16 + 1;
      puVar14 = puVar14 + lVar12;
    }
    for (; iVar16 = (int)uVar5, iVar13 < src->h + top; iVar13 = iVar13 + 1) {
      puVar7 = puVar19 + lVar4;
      for (uVar8 = 0; uVar18 != uVar8; uVar8 = uVar8 + 1) {
        *(undefined4 *)((long)pvVar17 + uVar8 * 4) = *puVar7;
        puVar7 = puVar7 + -1;
      }
      if (iVar16 < 0xc) {
        for (uVar8 = uVar18; (long)uVar8 < (long)(iVar16 + left); uVar8 = uVar8 + 1) {
          *(undefined4 *)((long)pvVar17 + uVar8 * 4) = puVar19[uVar8 - lVar4];
        }
        uVar2 = src->w;
      }
      else {
        memcpy((void *)(lVar4 * 4 + (long)pvVar17),puVar19,uVar5 << 2);
        uVar2 = src->w;
        uVar8 = (ulong)(uVar2 + iVar10);
      }
      uVar5 = (ulong)uVar2;
      iVar16 = (iVar15 + uVar2 * 2) - (int)uVar8;
      for (lVar6 = (long)(int)uVar8; lVar6 < lVar12; lVar6 = lVar6 + 1) {
        *(undefined4 *)((long)pvVar17 + lVar6 * 4) = puVar19[iVar16];
        iVar16 = iVar16 + -1;
      }
      puVar19 = puVar19 + (int)uVar2;
      pvVar17 = (void *)((long)pvVar17 + lVar1);
      puVar14 = puVar14 + lVar12;
    }
    puVar19 = puVar19 + -(long)(iVar16 * 2);
    for (; iVar13 < iVar3; iVar13 = iVar13 + 1) {
      puVar7 = puVar19 + lVar4;
      for (uVar8 = 0; uVar18 != uVar8; uVar8 = uVar8 + 1) {
        *(undefined4 *)((long)pvVar17 + uVar8 * 4) = *puVar7;
        puVar7 = puVar7 + -1;
      }
      if ((int)uVar5 < 0xc) {
        puVar7 = puVar14;
        for (uVar8 = uVar18; (long)uVar8 < (long)((int)uVar5 + left); uVar8 = uVar8 + 1) {
          *puVar7 = puVar19[uVar8 - lVar4];
          puVar7 = puVar7 + 1;
        }
        uVar2 = src->w;
      }
      else {
        memcpy((void *)(lVar4 * 4 + (long)pvVar17),puVar19,uVar5 << 2);
        uVar2 = src->w;
        uVar8 = (ulong)(uVar2 + iVar10);
      }
      uVar5 = (ulong)uVar2;
      iVar16 = (iVar15 + uVar2 * 2) - (int)uVar8;
      for (lVar6 = (long)(int)uVar8; lVar6 < lVar12; lVar6 = lVar6 + 1) {
        *(undefined4 *)((long)pvVar17 + lVar6 * 4) = puVar19[iVar16];
        iVar16 = iVar16 + -1;
      }
      pvVar17 = (void *)((long)pvVar17 + lVar1);
      puVar19 = puVar19 + -(long)(int)uVar2;
      puVar14 = puVar14 + lVar12;
    }
  }
  else if (type == 1) {
    iVar16 = 0;
    uVar18 = 0;
    if (0 < left) {
      uVar18 = (ulong)(uint)left;
    }
    iVar13 = 0;
    if (0 < top) {
      iVar13 = top;
    }
    lVar1 = lVar12 * 4;
    puVar14 = (undefined4 *)((long)pvVar17 + uVar18 * 4);
    for (; iVar15 = (int)uVar18, iVar16 != iVar13; iVar16 = iVar16 + 1) {
      for (uVar5 = 0; uVar18 != uVar5; uVar5 = uVar5 + 1) {
        *(undefined4 *)((long)pvVar17 + uVar5 * 4) = *puVar19;
      }
      iVar10 = src->w;
      if ((long)iVar10 < 0xc) {
        for (uVar5 = uVar18; (long)uVar5 < (long)(iVar10 + left); uVar5 = uVar5 + 1) {
          *(undefined4 *)((long)pvVar17 + uVar5 * 4) = puVar19[uVar5 - lVar4];
        }
        iVar10 = src->w;
      }
      else {
        memcpy((void *)(lVar4 * 4 + (long)pvVar17),puVar19,(long)iVar10 << 2);
        iVar10 = src->w;
        uVar5 = (ulong)(uint)(iVar10 + iVar15);
      }
      for (lVar6 = (long)(int)uVar5; lVar6 < lVar12; lVar6 = lVar6 + 1) {
        *(undefined4 *)((long)pvVar17 + lVar6 * 4) = puVar19[(long)iVar10 + -1];
      }
      pvVar17 = (void *)((long)pvVar17 + lVar1);
      puVar14 = puVar14 + lVar12;
    }
    for (; iVar13 < src->h + top; iVar13 = iVar13 + 1) {
      for (uVar5 = 0; uVar18 != uVar5; uVar5 = uVar5 + 1) {
        *(undefined4 *)((long)pvVar17 + uVar5 * 4) = *puVar19;
      }
      iVar16 = src->w;
      if ((long)iVar16 < 0xc) {
        for (uVar5 = uVar18; (long)uVar5 < (long)(iVar16 + left); uVar5 = uVar5 + 1) {
          *(undefined4 *)((long)pvVar17 + uVar5 * 4) = puVar19[uVar5 - lVar4];
        }
        iVar16 = src->w;
      }
      else {
        memcpy((void *)(lVar4 * 4 + (long)pvVar17),puVar19,(long)iVar16 << 2);
        iVar16 = src->w;
        uVar5 = (ulong)(uint)(iVar16 + iVar15);
      }
      for (lVar6 = (long)(int)uVar5; lVar6 < lVar12; lVar6 = lVar6 + 1) {
        *(undefined4 *)((long)pvVar17 + lVar6 * 4) = puVar19[iVar16 + -1];
      }
      puVar19 = puVar19 + iVar16;
      pvVar17 = (void *)((long)pvVar17 + lVar1);
      puVar14 = puVar14 + lVar12;
    }
    uVar5 = (ulong)src->w;
    puVar7 = puVar19 + -uVar5;
    lVar6 = uVar5 * 4;
    for (; iVar13 < iVar3; iVar13 = iVar13 + 1) {
      for (uVar8 = 0; uVar18 != uVar8; uVar8 = uVar8 + 1) {
        *(undefined4 *)((long)pvVar17 + uVar8 * 4) = *puVar7;
      }
      if ((int)uVar5 < 0xc) {
        puVar11 = puVar14;
        for (uVar8 = uVar18; (long)uVar8 < (long)((int)uVar5 + left); uVar8 = uVar8 + 1) {
          *puVar11 = *(undefined4 *)((long)puVar19 + (uVar8 * 4 - (lVar4 * 4 + lVar6)));
          puVar11 = puVar11 + 1;
        }
        uVar2 = src->w;
      }
      else {
        memcpy((void *)(lVar4 * 4 + (long)pvVar17),puVar7,(uVar5 & 0xffffffff) << 2);
        uVar2 = src->w;
        uVar8 = (ulong)(uVar2 + iVar15);
      }
      uVar5 = (ulong)uVar2;
      for (lVar9 = (long)(int)uVar8; lVar9 < lVar12; lVar9 = lVar9 + 1) {
        *(undefined4 *)((long)pvVar17 + lVar9 * 4) = puVar7[(long)(int)uVar2 + -1];
      }
      pvVar17 = (void *)((long)pvVar17 + lVar1);
      puVar14 = puVar14 + lVar12;
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }
    else if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }
    else if (type == 2)
    {
        int y = 0;
        // fill top
        ptr += top * src.w;
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= 2 * src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
    }

}